

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::OutputLinkLibraries
          (cmLocalGenerator *this,cmComputeLinkInformation *pcli,
          cmLinkLineComputer *linkLineComputer,string *linkLibraries,string *frameworkPath,
          string *linkPath)

{
  cmMakefile *pcVar1;
  char *pcVar2;
  string stdLibString;
  string standardLibsVar;
  string libPathTerminator;
  string fwSearchFlagVar;
  string fwSearchFlag;
  string libPathFlag;
  string linkLanguage;
  undefined1 *local_140;
  undefined8 local_138;
  undefined1 local_130 [16];
  string local_120;
  string *local_100;
  string *local_f8;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50 [32];
  
  local_100 = linkLibraries;
  local_f8 = linkPath;
  std::__cxx11::string::string(local_50,(string *)&pcli->LinkLanguage);
  pcVar1 = this->Makefile;
  std::__cxx11::string::string
            ((string *)&local_f0,"CMAKE_LIBRARY_PATH_FLAG",(allocator *)&local_120);
  pcVar2 = cmMakefile::GetRequiredDefinition(pcVar1,&local_f0);
  std::__cxx11::string::string((string *)&local_70,pcVar2,(allocator *)&local_140);
  std::__cxx11::string::~string((string *)&local_f0);
  pcVar1 = this->Makefile;
  std::__cxx11::string::string
            ((string *)&local_120,"CMAKE_LIBRARY_PATH_TERMINATOR",(allocator *)&local_140);
  pcVar2 = cmMakefile::GetSafeDefinition(pcVar1,&local_120);
  std::__cxx11::string::string((string *)&local_f0,pcVar2,(allocator *)&local_b0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)&local_120,"CMAKE_",(allocator *)&local_140);
  std::__cxx11::string::string((string *)&local_140,(string *)&pcli->LinkLanguage);
  std::__cxx11::string::append((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::append((char *)&local_120);
  local_140 = local_130;
  local_138 = 0;
  local_130[0] = 0;
  pcVar2 = cmMakefile::GetDefinition(this->Makefile,&local_120);
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::assign((char *)&local_140);
  }
  std::__cxx11::string::string((string *)&local_b0,"CMAKE_",(allocator *)&local_90);
  std::__cxx11::string::append((string *)&local_b0);
  std::__cxx11::string::append((char *)&local_b0);
  pcVar2 = cmMakefile::GetSafeDefinition(this->Makefile,&local_b0);
  std::__cxx11::string::string((string *)&local_90,pcVar2,(allocator *)&local_d0);
  cmLinkLineComputer::ComputeFrameworkPath(&local_d0,linkLineComputer,pcli,&local_90);
  std::__cxx11::string::operator=((string *)frameworkPath,(string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  cmLinkLineComputer::ComputeLinkPath(&local_d0,linkLineComputer,pcli,&local_70,&local_f0);
  std::__cxx11::string::operator=((string *)local_f8,(string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  (*linkLineComputer->_vptr_cmLinkLineComputer[3])(&local_d0,linkLineComputer,pcli,&local_140);
  std::__cxx11::string::operator=((string *)local_100,(string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void cmLocalGenerator::OutputLinkLibraries(
  cmComputeLinkInformation* pcli, cmLinkLineComputer* linkLineComputer,
  std::string& linkLibraries, std::string& frameworkPath,
  std::string& linkPath)
{
  cmComputeLinkInformation& cli = *pcli;

  std::string linkLanguage = cli.GetLinkLanguage();

  std::string libPathFlag =
    this->Makefile->GetRequiredDefinition("CMAKE_LIBRARY_PATH_FLAG");
  std::string libPathTerminator =
    this->Makefile->GetSafeDefinition("CMAKE_LIBRARY_PATH_TERMINATOR");

  // Add standard libraries for this language.
  std::string standardLibsVar = "CMAKE_";
  standardLibsVar += cli.GetLinkLanguage();
  standardLibsVar += "_STANDARD_LIBRARIES";
  std::string stdLibString;
  if (const char* stdLibs = this->Makefile->GetDefinition(standardLibsVar)) {
    stdLibString = stdLibs;
  }

  // Append the framework search path flags.
  std::string fwSearchFlagVar = "CMAKE_";
  fwSearchFlagVar += linkLanguage;
  fwSearchFlagVar += "_FRAMEWORK_SEARCH_FLAG";
  std::string fwSearchFlag =
    this->Makefile->GetSafeDefinition(fwSearchFlagVar);

  frameworkPath = linkLineComputer->ComputeFrameworkPath(cli, fwSearchFlag);
  linkPath =
    linkLineComputer->ComputeLinkPath(cli, libPathFlag, libPathTerminator);

  linkLibraries = linkLineComputer->ComputeLinkLibraries(cli, stdLibString);
}